

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void do_xsave_sse(CPUX86State *env,target_ulong ptr,uintptr_t ra)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (ulong)(*(byte *)((long)&env->hflags + 1) >> 7) * 8 + 8;
  lVar2 = 0xa0;
  do {
    cpu_stq_data_ra_x86_64(env,ptr + lVar2,*(uint64_t *)((long)env->segs + lVar2 * 4 + -0x20),ra);
    cpu_stq_data_ra_x86_64(env,ptr + lVar2 + 8,*(uint64_t *)((long)(env->segs + -1) + lVar2 * 4),ra)
    ;
    lVar2 = lVar2 + 0x10;
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  return;
}

Assistant:

static void do_xsave_sse(CPUX86State *env, target_ulong ptr, uintptr_t ra)
{
    int i, nb_xmm_regs;
    target_ulong addr;

    if (env->hflags & HF_CS64_MASK) {
        nb_xmm_regs = 16;
    } else {
        nb_xmm_regs = 8;
    }

    addr = ptr + XO(legacy.xmm_regs);
    for (i = 0; i < nb_xmm_regs; i++) {
        cpu_stq_data_ra(env, addr, env->xmm_regs[i].ZMM_Q(0), ra);
        cpu_stq_data_ra(env, addr + 8, env->xmm_regs[i].ZMM_Q(1), ra);
        addr += 16;
    }
}